

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall
Memory::Recycler::TrackUnallocated(Recycler *this,char *address,char *endAddress,size_t sizeCat)

{
  code *pcVar1;
  bool bVar2;
  TrackerData *pTVar3;
  undefined4 *puVar4;
  size_t sizeCat_local;
  char *endAddress_local;
  char *address_local;
  Recycler *this_local;
  
  if (((DAT_01eca381 & 1) == 0) && (this->trackerDictionary != (TypeInfotoTrackerItemMap *)0x0)) {
    CCLock::Enter(&this->trackerCriticalSection->super_CCLock);
    for (endAddress_local = address; endAddress_local + sizeCat <= endAddress;
        endAddress_local = endAddress_local + sizeCat) {
      pTVar3 = GetTrackerData(this,endAddress_local);
      if (pTVar3 != (TrackerData *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0x209e,"(GetTrackerData(address) == nullptr)",
                           "GetTrackerData(address) == nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      SetTrackerData(this,endAddress_local,&TrackerData::EmptyData);
    }
    CCLock::Leave(&this->trackerCriticalSection->super_CCLock);
  }
  return;
}

Assistant:

void
Recycler::TrackUnallocated(__in char* address, __in  char *endAddress, size_t sizeCat)
{
    if (!CONFIG_FLAG(KeepRecyclerTrackData))
    {
        if (this->trackerDictionary != nullptr)
        {
            trackerCriticalSection->Enter();
            while (address + sizeCat <= endAddress)
            {
                Assert(GetTrackerData(address) == nullptr);
                SetTrackerData(address, &TrackerData::EmptyData);
                address += sizeCat;
            }
            trackerCriticalSection->Leave();
        }
    }
}